

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::Compaction::~Compaction(Compaction *this)

{
  long lVar1;
  pointer ppFVar2;
  void *pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->input_version_ != (Version *)0x0) {
    Version::Unref(this->input_version_);
  }
  ppFVar2 = (this->grandparents_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar2 != (pointer)0x0) {
    operator_delete(ppFVar2,(long)(this->grandparents_).
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar2
                   );
  }
  lVar4 = 0;
  do {
    pvVar3 = *(void **)((long)&this->inputs_[1].
                               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)&this->inputs_[1].
                                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar4) - (long)pvVar3);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x30);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    VersionEdit::~VersionEdit(&this->edit_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Compaction::~Compaction() {
  if (input_version_ != nullptr) {
    input_version_->Unref();
  }
}